

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void btFactorLDLT(btScalar *A,btScalar *d,int n,int nskip1)

{
  btScalar *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int i;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  btScalar *pbVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  btScalar *pbVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  btScalar *pbVar28;
  long lVar29;
  btScalar *pbVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  long local_c8;
  btScalar *local_b8;
  btScalar *local_b0;
  long local_a8;
  long local_a0;
  btScalar *local_98;
  
  if (0 < n) {
    lVar21 = (long)nskip1;
    lVar22 = (long)(nskip1 + 1);
    lVar16 = lVar21 * 8;
    pbVar12 = A + (nskip1 + 5);
    pbVar28 = A + (nskip1 + 4);
    local_b0 = A + (nskip1 + 3);
    local_b8 = A + (nskip1 + 2);
    pbVar1 = A + lVar21;
    local_c8 = 0;
    iVar10 = 0;
    pfVar9 = A + lVar22;
    pbVar30 = A;
    local_a8 = lVar22 * 4;
    local_a0 = lVar21 * 4;
    local_98 = pbVar1;
    for (uVar25 = 0; (long)uVar25 <= (long)(n + -2); uVar25 = uVar25 + 2) {
      lVar29 = 0;
      lVar15 = lVar21 * 4;
      lVar20 = lVar22 * 4;
      for (uVar7 = 0; uVar7 < uVar25; uVar7 = uVar7 + 2) {
        fVar31 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        lVar8 = lVar15;
        lVar11 = local_a0;
        lVar13 = lVar29;
        pfVar19 = pfVar9;
        lVar17 = lVar20;
        lVar24 = local_a8;
        lVar26 = local_c8;
        for (uVar23 = uVar7 & 0xffffffff; 1 < (int)uVar23; uVar23 = (ulong)((int)uVar23 - 2)) {
          fVar2 = *(float *)((long)A + lVar26 + 4);
          fVar45 = *(float *)((long)A + lVar13 + 4);
          fVar31 = fVar31 + *(float *)((long)A + lVar26) * *(float *)((long)A + lVar13) +
                   fVar2 * fVar45;
          fVar34 = fVar34 + *(float *)((long)A + lVar11) * *(float *)((long)A + lVar13) +
                   *(float *)((long)A + lVar24) * fVar45;
          fVar35 = fVar35 + *(float *)((long)A + lVar8) * *(float *)((long)A + lVar26) +
                   *(float *)((long)A + lVar17) * fVar2;
          fVar36 = fVar36 + *(float *)((long)A + lVar8) * *(float *)((long)A + lVar11) +
                   *(float *)((long)A + lVar17) * *(float *)((long)A + lVar24);
          lVar26 = lVar26 + 8;
          lVar24 = lVar24 + 8;
          lVar11 = lVar11 + 8;
          lVar13 = lVar13 + 8;
          lVar17 = lVar17 + 8;
          lVar8 = lVar8 + 8;
          pfVar19 = pfVar19 + 2;
        }
        pfVar27 = (float *)(lVar26 + (long)A);
        pbVar18 = A;
        for (; 0 < (int)uVar23; uVar23 = (ulong)((int)uVar23 - 1)) {
          fVar2 = *pfVar27;
          pfVar27 = pfVar27 + 1;
          fVar31 = fVar31 + fVar2 * *(float *)((long)pbVar18 + lVar13);
          fVar34 = fVar34 + *(float *)((long)pbVar18 + lVar11) * *(float *)((long)pbVar18 + lVar13);
          fVar35 = fVar35 + *(float *)((long)pbVar18 + lVar8) * fVar2;
          fVar36 = fVar36 + *(float *)((long)pbVar18 + lVar8) * *(float *)((long)pbVar18 + lVar11);
          pfVar19 = pfVar19 + 1;
          pbVar18 = pbVar18 + 1;
        }
        fVar2 = *pfVar27;
        *pfVar27 = fVar2 - fVar31;
        fVar34 = *(float *)((long)pbVar18 + lVar11) - fVar34;
        *(float *)((long)pbVar18 + lVar11) = fVar34;
        fVar45 = *(float *)((long)pbVar18 + lVar8);
        pfVar27[1] = (pfVar27[1] - fVar35) - (fVar2 - fVar31) * fVar45;
        *pfVar19 = (*pfVar19 - fVar36) - fVar34 * fVar45;
        lVar29 = lVar29 + lVar16;
        lVar20 = lVar20 + lVar16;
        lVar15 = lVar15 + lVar16;
      }
      fVar31 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      lVar20 = 0;
      lVar15 = local_c8;
      for (uVar7 = uVar25 & 0xffffffff; 5 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 6)) {
        fVar36 = *(float *)((long)pbVar30 + lVar20);
        fVar2 = *(float *)((long)local_98 + lVar20);
        fVar39 = *(float *)((long)d + lVar20) * fVar36;
        fVar46 = *(float *)((long)d + lVar20) * fVar2;
        *(float *)((long)pbVar30 + lVar20) = fVar39;
        *(float *)((long)local_98 + lVar20) = fVar46;
        fVar45 = *(float *)((long)pbVar30 + lVar20 + 4);
        fVar52 = *(float *)((long)pfVar9 + lVar20);
        fVar47 = *(float *)((long)d + lVar20 + 4);
        fVar40 = fVar47 * fVar45;
        fVar47 = fVar47 * fVar52;
        *(float *)((long)pbVar30 + lVar20 + 4) = fVar40;
        *(float *)((long)pfVar9 + lVar20) = fVar47;
        fVar32 = *(float *)((long)pbVar30 + lVar20 + 8);
        fVar33 = *(float *)((long)local_b8 + lVar20);
        fVar48 = *(float *)((long)d + lVar20 + 8);
        fVar41 = fVar48 * fVar32;
        fVar48 = fVar48 * fVar33;
        *(float *)((long)pbVar30 + lVar20 + 8) = fVar41;
        *(float *)((long)local_b8 + lVar20) = fVar48;
        fVar37 = *(float *)((long)pbVar30 + lVar20 + 0xc);
        fVar38 = *(float *)((long)local_b0 + lVar20);
        fVar49 = *(float *)((long)d + lVar20 + 0xc);
        fVar42 = fVar49 * fVar37;
        fVar49 = fVar49 * fVar38;
        *(float *)((long)pbVar30 + lVar20 + 0xc) = fVar42;
        *(float *)((long)local_b0 + lVar20) = fVar49;
        fVar3 = *(float *)((long)pbVar30 + lVar20 + 0x10);
        fVar4 = *(float *)((long)pbVar28 + lVar20);
        fVar50 = *(float *)((long)d + lVar20 + 0x10);
        fVar43 = fVar50 * fVar3;
        fVar50 = fVar50 * fVar4;
        *(float *)((long)pbVar30 + lVar20 + 0x10) = fVar43;
        *(float *)((long)pbVar28 + lVar20) = fVar50;
        fVar5 = *(float *)((long)pbVar30 + lVar20 + 0x14);
        fVar6 = *(float *)((long)pbVar12 + lVar20);
        fVar51 = *(float *)((long)d + lVar20 + 0x14);
        fVar44 = fVar51 * fVar5;
        fVar51 = fVar51 * fVar6;
        *(float *)((long)pbVar30 + lVar20 + 0x14) = fVar44;
        *(float *)((long)pbVar12 + lVar20) = fVar51;
        fVar35 = fVar5 * fVar44 +
                 fVar3 * fVar43 +
                 fVar37 * fVar42 + fVar32 * fVar41 + fVar45 * fVar40 + fVar35 + fVar36 * fVar39;
        fVar31 = fVar6 * fVar44 +
                 fVar4 * fVar43 +
                 fVar38 * fVar42 + fVar33 * fVar41 + fVar52 * fVar40 + fVar31 + fVar2 * fVar39;
        fVar34 = fVar6 * fVar51 +
                 fVar4 * fVar50 +
                 fVar38 * fVar49 + fVar33 * fVar48 + fVar52 * fVar47 + fVar34 + fVar2 * fVar46;
        lVar20 = lVar20 + 0x18;
        lVar15 = lVar15 + 0x18;
      }
      pfVar19 = (float *)(lVar20 + (long)d);
      while( true ) {
        fVar36 = *(float *)((long)A + lVar15);
        if ((int)uVar7 < 1) break;
        fVar2 = *(float *)((long)pbVar1 + lVar15);
        fVar45 = *pfVar19 * fVar36;
        fVar52 = *pfVar19 * fVar2;
        *(float *)((long)A + lVar15) = fVar45;
        *(float *)((long)pbVar1 + lVar15) = fVar52;
        fVar35 = fVar35 + fVar36 * fVar45;
        fVar31 = fVar31 + fVar2 * fVar45;
        fVar34 = fVar34 + fVar2 * fVar52;
        pfVar19 = pfVar19 + 1;
        uVar7 = (ulong)((int)uVar7 - 1);
        lVar15 = lVar15 + 4;
      }
      fVar31 = *(float *)((long)pbVar1 + lVar15) - fVar31;
      fVar2 = *(float *)((long)(A + lVar22) + lVar15);
      fVar35 = 1.0 / (fVar36 - fVar35);
      d[uVar25] = fVar35;
      fVar35 = fVar35 * fVar31;
      d[uVar25 + 1] = 1.0 / ((fVar2 - fVar34) - (fVar31 * fVar35 + 0.0));
      *(float *)((long)pbVar1 + lVar15) = fVar35;
      iVar10 = iVar10 + nskip1 * 2;
      local_c8 = local_c8 + lVar16;
      local_a8 = local_a8 + lVar16;
      local_a0 = local_a0 + lVar16;
      pfVar9 = pfVar9 + lVar21 * 2;
      pbVar30 = pbVar30 + lVar21 * 2;
      pbVar12 = pbVar12 + lVar21 * 2;
      pbVar28 = pbVar28 + lVar21 * 2;
      local_b0 = local_b0 + lVar21 * 2;
      local_b8 = local_b8 + lVar21 * 2;
      local_98 = local_98 + lVar21 * 2;
    }
    if (n - (int)uVar25 == 1) {
      pfVar9 = A + (int)uVar25 * nskip1;
      uVar7 = uVar25 & 0xffffffff;
      lVar22 = lVar22 << 2;
      lVar15 = lVar21 << 2;
      lVar20 = 0;
      for (uVar23 = 0; uVar23 < uVar7; uVar23 = uVar23 + 2) {
        fVar31 = 0.0;
        fVar34 = 0.0;
        pbVar12 = A;
        lVar29 = lVar20;
        for (uVar14 = uVar23 & 0xffffffff; 1 < (int)uVar14; uVar14 = (ulong)((int)uVar14 - 2)) {
          fVar31 = fVar31 + *(float *)((long)pbVar12 + lVar20) * pbVar12[iVar10] +
                   *(float *)((long)pbVar12 + lVar20 + 4) * pbVar12[(long)iVar10 + 1];
          fVar34 = fVar34 + *(float *)((long)pbVar12 + lVar15) * pbVar12[iVar10] +
                   *(float *)((long)pbVar12 + lVar22) * pbVar12[(long)iVar10 + 1];
          pbVar12 = pbVar12 + 2;
          lVar29 = lVar29 + 8;
        }
        pfVar19 = pbVar12 + iVar10;
        for (; 0 < (int)uVar14; uVar14 = (ulong)((int)uVar14 - 1)) {
          fVar35 = *pfVar19;
          pfVar19 = pfVar19 + 1;
          fVar31 = fVar31 + *(float *)((long)A + lVar29) * fVar35;
          fVar34 = fVar34 + *(float *)((long)A + lVar29 + lVar21 * 4) * fVar35;
          lVar29 = lVar29 + 4;
        }
        fVar35 = *pfVar19;
        *pfVar19 = fVar35 - fVar31;
        pfVar19[1] = (pfVar19[1] - fVar34) -
                     (fVar35 - fVar31) * *(float *)((long)A + lVar29 + lVar21 * 4);
        lVar20 = lVar20 + lVar16;
        lVar22 = lVar22 + lVar16;
        lVar15 = lVar15 + lVar16;
      }
      fVar31 = 0.0;
      pbVar12 = d;
      for (; 5 < (int)uVar25; uVar25 = (ulong)((int)uVar25 - 6)) {
        fVar34 = *pfVar9;
        fVar35 = pfVar9[1];
        fVar38 = *pbVar12 * fVar34;
        *pfVar9 = fVar38;
        fVar32 = pbVar12[1] * fVar35;
        pfVar9[1] = fVar32;
        fVar36 = pfVar9[2];
        fVar48 = pbVar12[2] * fVar36;
        pfVar9[2] = fVar48;
        fVar2 = pfVar9[3];
        fVar33 = pbVar12[3] * fVar2;
        pfVar9[3] = fVar33;
        fVar45 = pfVar9[4];
        fVar37 = pbVar12[4] * fVar45;
        pfVar9[4] = fVar37;
        fVar52 = pfVar9[5];
        fVar47 = pbVar12[5] * fVar52;
        pfVar9[5] = fVar47;
        fVar31 = fVar47 * fVar52 +
                 fVar37 * fVar45 +
                 fVar33 * fVar2 + fVar48 * fVar36 + fVar32 * fVar35 + fVar31 + fVar38 * fVar34;
        pfVar9 = pfVar9 + 6;
        pbVar12 = pbVar12 + 6;
      }
      lVar16 = 0;
      while( true ) {
        fVar34 = *(float *)((long)pfVar9 + lVar16);
        if ((int)uVar25 < 1) break;
        fVar35 = *(float *)((long)pbVar12 + lVar16) * fVar34;
        *(float *)((long)pfVar9 + lVar16) = fVar35;
        fVar31 = fVar31 + fVar35 * fVar34;
        uVar25 = (ulong)((int)uVar25 - 1);
        lVar16 = lVar16 + 4;
      }
      d[uVar7] = 1.0 / (fVar34 - fVar31);
    }
  }
  return;
}

Assistant:

void btFactorLDLT (btScalar *A, btScalar *d, int n, int nskip1)
{  
  int i,j;
  btScalar sum,*ell,*dee,dd,p1,p2,q1,q2,Z11,m11,Z21,m21,Z22,m22;
  if (n < 1) return;
  
  for (i=0; i<=n-2; i += 2) {
    /* solve L*(D*l)=a, l is scaled elements in 2 x i block at A(i,0) */
    btSolveL1_2 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 2 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    Z21 = 0;
    Z22 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[1];
      p2 = ell[1+nskip1];
      dd = dee[1];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[1] = q1;
      ell[1+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[2];
      p2 = ell[2+nskip1];
      dd = dee[2];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[2] = q1;
      ell[2+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[3];
      p2 = ell[3+nskip1];
      dd = dee[3];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[3] = q1;
      ell[3+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[4];
      p2 = ell[4+nskip1];
      dd = dee[4];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[4] = q1;
      ell[4+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[5];
      p2 = ell[5+nskip1];
      dd = dee[5];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[5] = q1;
      ell[5+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell++;
      dee++;
    }
    /* solve for diagonal 2 x 2 block at A(i,i) */
    Z11 = ell[0] - Z11;
    Z21 = ell[nskip1] - Z21;
    Z22 = ell[1+nskip1] - Z22;
    dee = d + i;
    /* factorize 2 x 2 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* factorize row 2 */
    sum = 0;
    q1 = Z21;
    q2 = q1 * dee[0];
    Z21 = q2;
    sum += q1*q2;
    dee[1] = btRecip(Z22 - sum);
    /* done factorizing 2 x 2 block */
    ell[nskip1] = Z21;
  }
  /* compute the (less than 2) rows at the bottom */
  switch (n-i) {
    case 0:
    break;
    
    case 1:
    btSolveL1_1 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 1 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[1];
      dd = dee[1];
      q1 = p1*dd;
      ell[1] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[2];
      dd = dee[2];
      q1 = p1*dd;
      ell[2] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[3];
      dd = dee[3];
      q1 = p1*dd;
      ell[3] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[4];
      dd = dee[4];
      q1 = p1*dd;
      ell[4] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[5];
      dd = dee[5];
      q1 = p1*dd;
      ell[5] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell++;
      dee++;
    }
    /* solve for diagonal 1 x 1 block at A(i,i) */
    Z11 = ell[0] - Z11;
    dee = d + i;
    /* factorize 1 x 1 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* done factorizing 1 x 1 block */
    break;
    
    //default: *((char*)0)=0;  /* this should never happen! */
  }
}